

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ConfigDeclarationSyntax::ConfigDeclarationSyntax
          (ConfigDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token config,Token name,
          Token semi1,SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *localparams,
          Token design,SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *topCells,Token semi2,
          SyntaxList<slang::syntax::ConfigRuleSyntax> *rules,Token endconfig,
          NamedBlockClauseSyntax *blockName)

{
  undefined4 uVar1;
  bool bVar2;
  reference ppPVar3;
  reference ppCVar4;
  reference ppCVar5;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  ConfigRuleSyntax *child_2;
  iterator __end2_2;
  iterator __begin2_2;
  SyntaxList<slang::syntax::ConfigRuleSyntax> *__range2_2;
  ConfigCellIdentifierSyntax *child_1;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *__range2_1;
  ParameterDeclarationStatementSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *__range2;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *this_00;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *this_01;
  span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL> *this_02;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  __normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
  local_60;
  SyntaxNode **local_58;
  ParameterDeclarationStatementSyntax *local_50;
  ParameterDeclarationStatementSyntax **local_48;
  __normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
  local_40;
  SyntaxNode **local_38;
  undefined8 local_20;
  SyntaxNode *local_18;
  SyntaxNode *local_10;
  SyntaxNode *local_8;
  
  this_02 = (span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL> *)
            &__begin2_2;
  this_01 = (SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *)&stack0x00000020;
  this_00 = (SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *)&stack0x00000008;
  local_20 = in_R8;
  local_18 = in_R9;
  local_10 = in_RDX;
  local_8 = in_RCX;
  MemberSyntax::MemberSyntax
            ((MemberSyntax *)in_stack_ffffffffffffff80._M_current,
             (SyntaxKind)((ulong)in_stack_ffffffffffffff78 >> 0x20),in_stack_ffffffffffffff70);
  in_RDI[3].parent = local_10;
  in_RDI[3].previewNode = local_8;
  *(undefined8 *)(in_RDI + 4) = local_20;
  in_RDI[4].parent = local_18;
  in_RDI[4].previewNode = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[5].kind = (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[5].field_0x4 = uVar1;
  SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)this_01,
             (SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)this_00);
  in_RDI[7].previewNode = (SyntaxNode *)(this_01->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_01->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[8].kind = (this_01->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[8].field_0x4 = uVar1;
  SyntaxList<slang::syntax::ConfigCellIdentifierSyntax>::SyntaxList(this_01,this_00);
  in_RDI[10].previewNode = (SyntaxNode *)this_02->_M_ptr;
  *(size_t *)(in_RDI + 0xb) = (this_02->_M_extent)._M_extent_value;
  SyntaxList<slang::syntax::ConfigRuleSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::ConfigRuleSyntax> *)this_01,
             (SyntaxList<slang::syntax::ConfigRuleSyntax> *)this_00);
  in_RDI[0xd].previewNode = (SyntaxNode *)__end2_1._M_current;
  *(ConfigCellIdentifierSyntax ***)(in_RDI + 0xe) = __begin2_1._M_current;
  in_RDI[0xe].parent = (SyntaxNode *)__range2_1;
  *(SyntaxNode **)(in_RDI + 6) = in_RDI;
  local_38 = &in_RDI[5].parent;
  local_40._M_current =
       (ParameterDeclarationStatementSyntax **)
       std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>::
       begin((span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL> *)
             this_00);
  local_48 = (ParameterDeclarationStatementSyntax **)
             std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>
             ::end(this_02);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
                        *)this_01,
                       (__normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
                        *)this_00);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppPVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_40);
    local_50 = *ppPVar3;
    (local_50->super_MemberSyntax).super_SyntaxNode.parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::ParameterDeclarationStatementSyntax_**,_std::span<slang::syntax::ParameterDeclarationStatementSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_40);
  }
  *(SyntaxNode **)(in_RDI + 9) = in_RDI;
  local_58 = &in_RDI[8].parent;
  local_60._M_current =
       (ConfigCellIdentifierSyntax **)
       std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL> *)
                  this_00);
  std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL> *)this_02);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
                        *)this_01,
                       (__normal_iterator<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
                        *)this_00);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppCVar4 = __gnu_cxx::
              __normal_iterator<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_60);
    ((*ppCVar4)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::ConfigCellIdentifierSyntax_**,_std::span<slang::syntax::ConfigCellIdentifierSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_60);
  }
  *(SyntaxNode **)(in_RDI + 0xc) = in_RDI;
  std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL> *)this_00);
  std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL> *)this_02);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                        *)this_01,
                       (__normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                        *)this_00);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppCVar5 = __gnu_cxx::
              __normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffff80);
    ((*ppCVar5)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::ConfigRuleSyntax_**,_std::span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffff80);
  }
  if (in_RDI[0xe].parent != (SyntaxNode *)0x0) {
    (in_RDI[0xe].parent)->parent = in_RDI;
  }
  return;
}

Assistant:

ConfigDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token config, Token name, Token semi1, const SyntaxList<ParameterDeclarationStatementSyntax>& localparams, Token design, const SyntaxList<ConfigCellIdentifierSyntax>& topCells, Token semi2, const SyntaxList<ConfigRuleSyntax>& rules, Token endconfig, NamedBlockClauseSyntax* blockName) :
        MemberSyntax(SyntaxKind::ConfigDeclaration, attributes), config(config), name(name), semi1(semi1), localparams(localparams), design(design), topCells(topCells), semi2(semi2), rules(rules), endconfig(endconfig), blockName(blockName) {
        this->localparams.parent = this;
        for (auto child : this->localparams)
            child->parent = this;
        this->topCells.parent = this;
        for (auto child : this->topCells)
            child->parent = this;
        this->rules.parent = this;
        for (auto child : this->rules)
            child->parent = this;
        if (this->blockName) this->blockName->parent = this;
    }